

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

void generate_non_global_ref
               (sexp_conflict ctx,sexp_conflict name,sexp_conflict cell,sexp_conflict lambda,
               sexp_conflict fv,int unboxp)

{
  sexp psVar1;
  sexp in_RCX;
  long in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  int *in_R8;
  int in_R9D;
  bool bVar2;
  sexp_conflict loc;
  sexp_uint_t i;
  sexp_uint_t in_stack_ffffffffffffffb8;
  uchar uVar3;
  sexp ctx_00;
  sexp in_stack_ffffffffffffffc8;
  int *local_28;
  
  ctx_00 = *(sexp *)(in_RDX + 0x10);
  uVar3 = (uchar)(in_stack_ffffffffffffffb8 >> 0x38);
  local_28 = in_R8;
  if (((ctx_00 == in_RCX) && (((ulong)in_RCX & 3) == 0)) && (in_RCX->tag == 0x1c)) {
    sexp_emit(ctx_00,uVar3);
    psVar1 = in_RDI;
    sexp_param_index(in_stack_ffffffffffffffc8,ctx_00,in_RDI);
    sexp_emit_word(ctx_00,(sexp_uint_t)psVar1);
    uVar3 = (uchar)((ulong)psVar1 >> 0x38);
  }
  else {
    while( true ) {
      bVar2 = false;
      if (((ulong)local_28 & 3) == 0) {
        bVar2 = *local_28 == 6;
      }
      if ((!bVar2) ||
         ((in_RSI == *(sexp *)(*(long *)(local_28 + 2) + 8) &&
          (ctx_00 == *(sexp *)(*(long *)(*(long *)(local_28 + 2) + 0x10) + 0x10))))) break;
      local_28 = *(int **)(local_28 + 4);
    }
    sexp_emit(ctx_00,uVar3);
    sexp_emit_word(ctx_00,in_stack_ffffffffffffffb8);
    uVar3 = (uchar)(in_stack_ffffffffffffffb8 >> 0x38);
  }
  if ((in_R9D != 0) &&
     (psVar1 = sexp_memq_op(in_RDI,(sexp)0x0,2,in_RSI,(ctx_00->value).type.dl),
     psVar1 != (sexp)&DAT_0000003e)) {
    sexp_emit(ctx_00,uVar3);
  }
  sexp_inc_context_depth(in_RDI,1);
  return;
}

Assistant:

static void generate_non_global_ref (sexp ctx, sexp name, sexp cell,
                                     sexp lambda, sexp fv, int unboxp) {
  sexp_uint_t i;
  sexp loc = sexp_cdr(cell);
  if (loc == lambda && sexp_lambdap(lambda)) {
    /* local ref */
    sexp_emit(ctx, SEXP_OP_LOCAL_REF);
    sexp_emit_word(ctx, sexp_param_index(ctx, lambda, name));
  } else {
    /* closure ref */
    for (i=0; sexp_pairp(fv); fv=sexp_cdr(fv), i++)
      if ((name == sexp_ref_name(sexp_car(fv)))
          && (loc == sexp_ref_loc(sexp_car(fv))))
        break;
    sexp_emit(ctx, SEXP_OP_CLOSURE_REF);
    sexp_emit_word(ctx, i);
  }
  if (unboxp && (sexp_truep(sexp_memq(ctx, name, sexp_lambda_sv(loc)))))
    sexp_emit(ctx, SEXP_OP_CDR);
  sexp_inc_context_depth(ctx, +1);
}